

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegCheckCharacterRange
              (xmlRegAtomType type,int codepoint,int neg,int start,int end,xmlChar *blockName)

{
  int iVar1;
  uint local_44;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  uint local_2c;
  int ret;
  xmlChar *blockName_local;
  int end_local;
  int start_local;
  int neg_local;
  int codepoint_local;
  xmlRegAtomType type_local;
  
  local_2c = 0;
  end_local = neg;
  switch(type) {
  case XML_REGEXP_EPSILON:
  case XML_REGEXP_RANGES:
  case XML_REGEXP_SUBREG:
  case XML_REGEXP_STRING:
    return -1;
  case XML_REGEXP_CHARVAL:
    local_3a = start <= codepoint && codepoint <= end;
    local_2c = (uint)local_3a;
    break;
  case XML_REGEXP_ANYCHAR:
    local_39 = codepoint != 10 && codepoint != 0xd;
    local_2c = (uint)local_39;
    break;
  case XML_REGEXP_NOTSPACE:
    end_local = (int)((neg != 0 ^ 0xffU) & 1);
  case XML_REGEXP_ANYSPACE:
    local_3b = true;
    if (((codepoint != 10) && (local_3b = true, codepoint != 0xd)) &&
       (local_3b = true, codepoint != 9)) {
      local_3b = codepoint == 0x20;
    }
    local_2c = (uint)local_3b;
    break;
  case XML_REGEXP_INITNAME:
    goto switchD_00202d7b_caseD_9;
  case XML_REGEXP_NOTINITNAME:
    end_local = (int)((neg != 0 ^ 0xffU) & 1);
switchD_00202d7b_caseD_9:
    if (codepoint < 0x100) {
      if (((((codepoint < 0x41) || (local_3c = true, 0x5a < codepoint)) &&
           ((codepoint < 0x61 || (local_3c = true, 0x7a < codepoint)))) &&
          (((codepoint < 0xc0 || (local_3c = true, 0xd6 < codepoint)) &&
           ((codepoint < 0xd8 || (local_3c = true, 0xf6 < codepoint)))))) &&
         (local_3c = true, codepoint < 0xf8)) {
LAB_00202ed7:
        if (((codepoint < 0x100) ||
            ((((codepoint < 0x4e00 || (local_3c = true, 0x9fa5 < codepoint)) &&
              (local_3c = true, codepoint != 0x3007)) &&
             ((codepoint < 0x3021 || (local_3c = true, 0x3029 < codepoint)))))) &&
           (local_3c = true, codepoint != 0x5f)) {
          local_3c = codepoint == 0x3a;
        }
      }
    }
    else {
      iVar1 = xmlCharInRange(codepoint,&xmlIsBaseCharGroup);
      local_3c = true;
      if (iVar1 == 0) goto LAB_00202ed7;
    }
    local_2c = (uint)local_3c;
    break;
  case XML_REGEXP_NAMECHAR:
    goto switchD_00202d7b_caseD_b;
  case XML_REGEXP_NOTNAMECHAR:
    end_local = (int)((neg != 0 ^ 0xffU) & 1);
switchD_00202d7b_caseD_b:
    if (codepoint < 0x100) {
      if ((((((codepoint < 0x41) || (local_3d = true, 0x5a < codepoint)) &&
            ((codepoint < 0x61 || (local_3d = true, 0x7a < codepoint)))) &&
           ((codepoint < 0xc0 || (local_3d = true, 0xd6 < codepoint)))) &&
          ((codepoint < 0xd8 || (local_3d = true, 0xf6 < codepoint)))) &&
         (local_3d = true, codepoint < 0xf8)) {
LAB_00203009:
        if ((codepoint < 0x100) ||
           ((((codepoint < 0x4e00 || (local_3d = true, 0x9fa5 < codepoint)) &&
             (local_3d = true, codepoint != 0x3007)) &&
            ((codepoint < 0x3021 || (local_3d = true, 0x3029 < codepoint)))))) {
          if (codepoint < 0x100) {
            if ((codepoint < 0x30) || (local_3d = true, 0x39 < codepoint)) {
LAB_002030b1:
              local_3d = true;
              if ((codepoint != 0x2e) &&
                 (((local_3d = true, codepoint != 0x2d && (local_3d = true, codepoint != 0x5f)) &&
                  (local_3d = true, codepoint != 0x3a)))) {
                if (0xff < codepoint) {
                  iVar1 = xmlCharInRange(codepoint,&xmlIsCombiningGroup);
                  local_3d = true;
                  if (iVar1 != 0) goto LAB_00203152;
                }
                if (codepoint < 0x100) {
                  local_44 = (uint)(codepoint == 0xb7);
                }
                else {
                  local_44 = xmlCharInRange(codepoint,&xmlIsExtenderGroup);
                }
                local_3d = local_44 != 0;
              }
            }
          }
          else {
            iVar1 = xmlCharInRange(codepoint,&xmlIsDigitGroup);
            local_3d = true;
            if (iVar1 == 0) goto LAB_002030b1;
          }
        }
      }
    }
    else {
      iVar1 = xmlCharInRange(codepoint,&xmlIsBaseCharGroup);
      local_3d = true;
      if (iVar1 == 0) goto LAB_00203009;
    }
LAB_00203152:
    local_2c = (uint)local_3d;
    break;
  case XML_REGEXP_DECIMAL:
    goto switchD_00202d7b_caseD_d;
  case XML_REGEXP_NOTDECIMAL:
    end_local = (int)((neg != 0 ^ 0xffU) & 1);
switchD_00202d7b_caseD_d:
    local_2c = xmlUCSIsCatNd(codepoint);
    break;
  case XML_REGEXP_REALCHAR:
    end_local = (int)((neg != 0 ^ 0xffU) & 1);
  case XML_REGEXP_NOTREALCHAR:
    local_2c = xmlUCSIsCatP(codepoint);
    if (local_2c == 0) {
      local_2c = xmlUCSIsCatZ(codepoint);
    }
    if (local_2c == 0) {
      local_2c = xmlUCSIsCatC(codepoint);
    }
    break;
  case XML_REGEXP_LETTER:
    local_2c = xmlUCSIsCatL(codepoint);
    break;
  case XML_REGEXP_LETTER_UPPERCASE:
    local_2c = xmlUCSIsCatLu(codepoint);
    break;
  case XML_REGEXP_LETTER_LOWERCASE:
    local_2c = xmlUCSIsCatLl(codepoint);
    break;
  case XML_REGEXP_LETTER_TITLECASE:
    local_2c = xmlUCSIsCatLt(codepoint);
    break;
  case XML_REGEXP_LETTER_MODIFIER:
    local_2c = xmlUCSIsCatLm(codepoint);
    break;
  case XML_REGEXP_LETTER_OTHERS:
    local_2c = xmlUCSIsCatLo(codepoint);
    break;
  case XML_REGEXP_MARK:
    local_2c = xmlUCSIsCatM(codepoint);
    break;
  case XML_REGEXP_MARK_NONSPACING:
    local_2c = xmlUCSIsCatMn(codepoint);
    break;
  case XML_REGEXP_MARK_SPACECOMBINING:
    local_2c = xmlUCSIsCatMc(codepoint);
    break;
  case XML_REGEXP_MARK_ENCLOSING:
    local_2c = xmlUCSIsCatMe(codepoint);
    break;
  case XML_REGEXP_NUMBER:
    local_2c = xmlUCSIsCatN(codepoint);
    break;
  case XML_REGEXP_NUMBER_DECIMAL:
    local_2c = xmlUCSIsCatNd(codepoint);
    break;
  case XML_REGEXP_NUMBER_LETTER:
    local_2c = xmlUCSIsCatNl(codepoint);
    break;
  case XML_REGEXP_NUMBER_OTHERS:
    local_2c = xmlUCSIsCatNo(codepoint);
    break;
  case XML_REGEXP_PUNCT:
    local_2c = xmlUCSIsCatP(codepoint);
    break;
  case XML_REGEXP_PUNCT_CONNECTOR:
    local_2c = xmlUCSIsCatPc(codepoint);
    break;
  case XML_REGEXP_PUNCT_DASH:
    local_2c = xmlUCSIsCatPd(codepoint);
    break;
  case XML_REGEXP_PUNCT_OPEN:
    local_2c = xmlUCSIsCatPs(codepoint);
    break;
  case XML_REGEXP_PUNCT_CLOSE:
    local_2c = xmlUCSIsCatPe(codepoint);
    break;
  case XML_REGEXP_PUNCT_INITQUOTE:
    local_2c = xmlUCSIsCatPi(codepoint);
    break;
  case XML_REGEXP_PUNCT_FINQUOTE:
    local_2c = xmlUCSIsCatPf(codepoint);
    break;
  case XML_REGEXP_PUNCT_OTHERS:
    local_2c = xmlUCSIsCatPo(codepoint);
    break;
  case XML_REGEXP_SEPAR:
    local_2c = xmlUCSIsCatZ(codepoint);
    break;
  case XML_REGEXP_SEPAR_SPACE:
    local_2c = xmlUCSIsCatZs(codepoint);
    break;
  case XML_REGEXP_SEPAR_LINE:
    local_2c = xmlUCSIsCatZl(codepoint);
    break;
  case XML_REGEXP_SEPAR_PARA:
    local_2c = xmlUCSIsCatZp(codepoint);
    break;
  case XML_REGEXP_SYMBOL:
    local_2c = xmlUCSIsCatS(codepoint);
    break;
  case XML_REGEXP_SYMBOL_MATH:
    local_2c = xmlUCSIsCatSm(codepoint);
    break;
  case XML_REGEXP_SYMBOL_CURRENCY:
    local_2c = xmlUCSIsCatSc(codepoint);
    break;
  case XML_REGEXP_SYMBOL_MODIFIER:
    local_2c = xmlUCSIsCatSk(codepoint);
    break;
  case XML_REGEXP_SYMBOL_OTHERS:
    local_2c = xmlUCSIsCatSo(codepoint);
    break;
  case XML_REGEXP_OTHER:
    local_2c = xmlUCSIsCatC(codepoint);
    break;
  case XML_REGEXP_OTHER_CONTROL:
    local_2c = xmlUCSIsCatCc(codepoint);
    break;
  case XML_REGEXP_OTHER_FORMAT:
    local_2c = xmlUCSIsCatCf(codepoint);
    break;
  case XML_REGEXP_OTHER_PRIVATE:
    local_2c = xmlUCSIsCatCo(codepoint);
    break;
  case XML_REGEXP_OTHER_NA:
    local_2c = 0;
    break;
  case XML_REGEXP_BLOCK_NAME:
    local_2c = xmlUCSIsBlock(codepoint,(char *)blockName);
  }
  if (end_local == 0) {
    codepoint_local = local_2c;
  }
  else {
    codepoint_local = (int)((local_2c != 0 ^ 0xffU) & 1);
  }
  return codepoint_local;
}

Assistant:

static int
xmlRegCheckCharacterRange(xmlRegAtomType type, int codepoint, int neg,
	                  int start, int end, const xmlChar *blockName) {
    int ret = 0;

    switch (type) {
        case XML_REGEXP_STRING:
        case XML_REGEXP_SUBREG:
        case XML_REGEXP_RANGES:
        case XML_REGEXP_EPSILON:
	    return(-1);
        case XML_REGEXP_ANYCHAR:
	    ret = ((codepoint != '\n') && (codepoint != '\r'));
	    break;
        case XML_REGEXP_CHARVAL:
	    ret = ((codepoint >= start) && (codepoint <= end));
	    break;
        case XML_REGEXP_NOTSPACE:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_ANYSPACE:
	    ret = ((codepoint == '\n') || (codepoint == '\r') ||
		   (codepoint == '\t') || (codepoint == ' '));
	    break;
        case XML_REGEXP_NOTINITNAME:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_INITNAME:
	    ret = (IS_LETTER(codepoint) ||
		   (codepoint == '_') || (codepoint == ':'));
	    break;
        case XML_REGEXP_NOTNAMECHAR:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_NAMECHAR:
	    ret = (IS_LETTER(codepoint) || IS_DIGIT(codepoint) ||
		   (codepoint == '.') || (codepoint == '-') ||
		   (codepoint == '_') || (codepoint == ':') ||
		   IS_COMBINING(codepoint) || IS_EXTENDER(codepoint));
	    break;
        case XML_REGEXP_NOTDECIMAL:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_DECIMAL:
	    ret = xmlUCSIsCatNd(codepoint);
	    break;
        case XML_REGEXP_REALCHAR:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_NOTREALCHAR:
	    ret = xmlUCSIsCatP(codepoint);
	    if (ret == 0)
		ret = xmlUCSIsCatZ(codepoint);
	    if (ret == 0)
		ret = xmlUCSIsCatC(codepoint);
	    break;
        case XML_REGEXP_LETTER:
	    ret = xmlUCSIsCatL(codepoint);
	    break;
        case XML_REGEXP_LETTER_UPPERCASE:
	    ret = xmlUCSIsCatLu(codepoint);
	    break;
        case XML_REGEXP_LETTER_LOWERCASE:
	    ret = xmlUCSIsCatLl(codepoint);
	    break;
        case XML_REGEXP_LETTER_TITLECASE:
	    ret = xmlUCSIsCatLt(codepoint);
	    break;
        case XML_REGEXP_LETTER_MODIFIER:
	    ret = xmlUCSIsCatLm(codepoint);
	    break;
        case XML_REGEXP_LETTER_OTHERS:
	    ret = xmlUCSIsCatLo(codepoint);
	    break;
        case XML_REGEXP_MARK:
	    ret = xmlUCSIsCatM(codepoint);
	    break;
        case XML_REGEXP_MARK_NONSPACING:
	    ret = xmlUCSIsCatMn(codepoint);
	    break;
        case XML_REGEXP_MARK_SPACECOMBINING:
	    ret = xmlUCSIsCatMc(codepoint);
	    break;
        case XML_REGEXP_MARK_ENCLOSING:
	    ret = xmlUCSIsCatMe(codepoint);
	    break;
        case XML_REGEXP_NUMBER:
	    ret = xmlUCSIsCatN(codepoint);
	    break;
        case XML_REGEXP_NUMBER_DECIMAL:
	    ret = xmlUCSIsCatNd(codepoint);
	    break;
        case XML_REGEXP_NUMBER_LETTER:
	    ret = xmlUCSIsCatNl(codepoint);
	    break;
        case XML_REGEXP_NUMBER_OTHERS:
	    ret = xmlUCSIsCatNo(codepoint);
	    break;
        case XML_REGEXP_PUNCT:
	    ret = xmlUCSIsCatP(codepoint);
	    break;
        case XML_REGEXP_PUNCT_CONNECTOR:
	    ret = xmlUCSIsCatPc(codepoint);
	    break;
        case XML_REGEXP_PUNCT_DASH:
	    ret = xmlUCSIsCatPd(codepoint);
	    break;
        case XML_REGEXP_PUNCT_OPEN:
	    ret = xmlUCSIsCatPs(codepoint);
	    break;
        case XML_REGEXP_PUNCT_CLOSE:
	    ret = xmlUCSIsCatPe(codepoint);
	    break;
        case XML_REGEXP_PUNCT_INITQUOTE:
	    ret = xmlUCSIsCatPi(codepoint);
	    break;
        case XML_REGEXP_PUNCT_FINQUOTE:
	    ret = xmlUCSIsCatPf(codepoint);
	    break;
        case XML_REGEXP_PUNCT_OTHERS:
	    ret = xmlUCSIsCatPo(codepoint);
	    break;
        case XML_REGEXP_SEPAR:
	    ret = xmlUCSIsCatZ(codepoint);
	    break;
        case XML_REGEXP_SEPAR_SPACE:
	    ret = xmlUCSIsCatZs(codepoint);
	    break;
        case XML_REGEXP_SEPAR_LINE:
	    ret = xmlUCSIsCatZl(codepoint);
	    break;
        case XML_REGEXP_SEPAR_PARA:
	    ret = xmlUCSIsCatZp(codepoint);
	    break;
        case XML_REGEXP_SYMBOL:
	    ret = xmlUCSIsCatS(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_MATH:
	    ret = xmlUCSIsCatSm(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_CURRENCY:
	    ret = xmlUCSIsCatSc(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_MODIFIER:
	    ret = xmlUCSIsCatSk(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_OTHERS:
	    ret = xmlUCSIsCatSo(codepoint);
	    break;
        case XML_REGEXP_OTHER:
	    ret = xmlUCSIsCatC(codepoint);
	    break;
        case XML_REGEXP_OTHER_CONTROL:
	    ret = xmlUCSIsCatCc(codepoint);
	    break;
        case XML_REGEXP_OTHER_FORMAT:
	    ret = xmlUCSIsCatCf(codepoint);
	    break;
        case XML_REGEXP_OTHER_PRIVATE:
	    ret = xmlUCSIsCatCo(codepoint);
	    break;
        case XML_REGEXP_OTHER_NA:
	    /* ret = xmlUCSIsCatCn(codepoint); */
	    /* Seems it doesn't exist anymore in recent Unicode releases */
	    ret = 0;
	    break;
        case XML_REGEXP_BLOCK_NAME:
	    ret = xmlUCSIsBlock(codepoint, (const char *) blockName);
	    break;
    }
    if (neg)
	return(!ret);
    return(ret);
}